

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_normal_octahedron_canonicalized_decoding_transform.h
# Opt level: O0

bool __thiscall
draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>::DecodeTransformData
          (PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *this,
          DecoderBuffer *buffer)

{
  bool bVar1;
  int32_t iVar2;
  DecoderBuffer *in_RSI;
  int center_value;
  int max_quantized_value;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined1 local_1;
  
  bVar1 = DecoderBuffer::Decode<int>
                    (in_RSI,(int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (bVar1) {
    bVar1 = DecoderBuffer::Decode<int>
                      (in_RSI,(int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if (bVar1) {
      bVar1 = PredictionSchemeNormalOctahedronTransformBase<int>::set_max_quantized_value
                        ((PredictionSchemeNormalOctahedronTransformBase<int> *)in_RSI,
                         in_stack_ffffffffffffffe4);
      if (bVar1) {
        iVar2 = PredictionSchemeNormalOctahedronTransformBase<int>::quantization_bits
                          ((PredictionSchemeNormalOctahedronTransformBase<int> *)0x1f68bc);
        if (iVar2 < 2) {
          local_1 = false;
        }
        else {
          iVar2 = PredictionSchemeNormalOctahedronTransformBase<int>::quantization_bits
                            ((PredictionSchemeNormalOctahedronTransformBase<int> *)0x1f68d1);
          if (iVar2 < 0x1f) {
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool DecodeTransformData(DecoderBuffer *buffer) {
    DataTypeT max_quantized_value, center_value;
    if (!buffer->Decode(&max_quantized_value)) {
      return false;
    }
    if (!buffer->Decode(&center_value)) {
      return false;
    }
    (void)center_value;
    if (!this->set_max_quantized_value(max_quantized_value)) {
      return false;
    }
    // Account for reading wrong values, e.g., due to fuzzing.
    if (this->quantization_bits() < 2) {
      return false;
    }
    if (this->quantization_bits() > 30) {
      return false;
    }
    return true;
  }